

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O0

bool __thiscall
cmFindProgramCommand::InitialPass
          (cmFindProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  bool bVar1;
  uint uVar2;
  undefined1 local_40 [8];
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argsIn_local;
  cmFindProgramCommand *this_local;
  
  result.field_2._8_8_ = argsIn;
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,"PROGRAM");
  uVar2 = (*(this->super_cmFindBase)._vptr_cmFindBase[2])(this,result.field_2._8_8_);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = cmFindCommon::ComputeIfDebugModeWanted
                      (&(this->super_cmFindBase).super_cmFindCommon,
                       &(this->super_cmFindBase).VariableName);
    (this->super_cmFindBase).super_cmFindCommon.DebugMode = bVar1;
    if (((this->super_cmFindBase).AlreadyDefined & 1U) == 0) {
      FindProgram_abi_cxx11_((string *)local_40,this);
      cmFindBase::StoreFindResult(&this->super_cmFindBase,(string *)local_40);
      this_local._7_1_ = true;
      std::__cxx11::string::~string((string *)local_40);
    }
    else {
      cmFindBase::NormalizeFindResult(&this->super_cmFindBase);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmFindProgramCommand::InitialPass(std::vector<std::string> const& argsIn)
{

  this->CMakePathName = "PROGRAM";

  // call cmFindBase::ParseArguments
  if (!this->ParseArguments(argsIn)) {
    return false;
  }
  this->DebugMode = this->ComputeIfDebugModeWanted(this->VariableName);

  if (this->AlreadyDefined) {
    this->NormalizeFindResult();
    return true;
  }

  std::string const result = this->FindProgram();
  this->StoreFindResult(result);
  return true;
}